

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  byte bVar2;
  uchar uVar3;
  cJSON_bool cVar4;
  cJSON_bool cVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar8;
  size_t sVar9;
  lconv *plVar10;
  ulong uVar11;
  ulong uVar12;
  uchar uVar13;
  cJSON *pcVar14;
  size_t sVar15;
  long lVar16;
  long in_FS_OFFSET;
  double dVar17;
  uchar number_buffer [26];
  double local_60;
  uchar local_58 [16];
  unkbyte10 Stack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = 0;
  cVar5 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    bVar2 = (byte)item->type;
    cVar5 = cVar4;
    if (bVar2 < 0x10) {
      switch(bVar2) {
      case 1:
        puVar8 = ensure(output_buffer,6);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"false",6);
LAB_00104139:
          cVar5 = 1;
        }
        break;
      case 2:
        puVar8 = ensure(output_buffer,5);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"true",5);
          goto LAB_00104139;
        }
        break;
      case 4:
        puVar8 = ensure(output_buffer,5);
        if (puVar8 != (uchar *)0x0) {
          builtin_memcpy(puVar8,"null",5);
          goto LAB_00104139;
        }
        break;
      case 8:
        dVar1 = item->valuedouble;
        Stack_48 = SUB1610((undefined1  [16])0x0,6);
        local_58[0] = '\0';
        local_58[1] = '\0';
        local_58[2] = '\0';
        local_58[3] = '\0';
        local_58[4] = 0;
        local_58[5] = '\0';
        local_58[6] = '\0';
        local_58[7] = '\0';
        local_58[8] = '\0';
        local_58[9] = '\0';
        local_58[10] = '\0';
        local_58[0xb] = '\0';
        local_58[0xc] = '\0';
        local_58[0xd] = '\0';
        local_58[0xe] = '\0';
        local_58[0xf] = '\0';
        plVar10 = localeconv();
        uVar3 = *plVar10->decimal_point;
        local_60 = 0.0;
        if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
          uVar6 = sprintf((char *)local_58,"%1.15g",dVar1);
          iVar7 = __isoc99_sscanf(local_58,"%lg",&local_60);
          if (iVar7 == 1) {
            dVar17 = ABS(local_60);
            if (ABS(local_60) <= ABS(dVar1)) {
              dVar17 = ABS(dVar1);
            }
            if (ABS(local_60 - dVar1) <= dVar17 * 2.220446049250313e-16) goto LAB_00104076;
          }
          uVar6 = sprintf((char *)local_58,"%1.17g",dVar1);
        }
        else {
          builtin_memcpy(local_58,"null",5);
          uVar6 = 4;
        }
LAB_00104076:
        cVar5 = 0;
        if (uVar6 < 0x1a) {
          uVar11 = (ulong)uVar6;
          puVar8 = ensure(output_buffer,uVar11 + 1);
          if (puVar8 != (uchar *)0x0) {
            uVar12 = 0;
            if (uVar6 != 0) {
              do {
                uVar13 = local_58[uVar12];
                if (local_58[uVar12] == uVar3) {
                  uVar13 = '.';
                }
                puVar8[uVar12] = uVar13;
                uVar12 = uVar12 + 1;
              } while (uVar11 != uVar12);
            }
            puVar8[uVar12] = '\0';
            output_buffer->offset = output_buffer->offset + uVar11;
            goto LAB_00104139;
          }
        }
      }
    }
    else if (bVar2 < 0x40) {
      if (bVar2 == 0x10) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          cVar5 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar5;
        }
        goto LAB_0010415d;
      }
      if (bVar2 == 0x20) {
        pcVar14 = item->child;
        puVar8 = ensure(output_buffer,1);
        if (puVar8 != (uchar *)0x0) {
          *puVar8 = '[';
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth + 1;
          for (; pcVar14 != (cJSON *)0x0; pcVar14 = pcVar14->next) {
            cVar4 = print_value(pcVar14,output_buffer);
            if (cVar4 == 0) goto switchD_00103c4a_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar15 = output_buffer->offset;
              sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
              output_buffer->offset = sVar9 + sVar15;
            }
            if (pcVar14->next != (cJSON *)0x0) {
              uVar11 = (ulong)(output_buffer->format == 0);
              puVar8 = ensure(output_buffer,uVar11 ^ 3);
              if (puVar8 == (uchar *)0x0) goto switchD_00103c4a_caseD_3;
              *puVar8 = ',';
              if (output_buffer->format == 0) {
                puVar8 = puVar8 + 1;
              }
              else {
                puVar8[1] = ' ';
                puVar8 = puVar8 + 2;
              }
              *puVar8 = '\0';
              output_buffer->offset = output_buffer->offset + (2 - uVar11);
            }
          }
          puVar8 = ensure(output_buffer,2);
          cVar5 = 0;
          if (puVar8 != (uchar *)0x0) {
            puVar8[0] = ']';
            puVar8[1] = '\0';
            goto LAB_00104135;
          }
        }
      }
    }
    else if (bVar2 == 0x40) {
      pcVar14 = item->child;
      uVar11 = (ulong)(output_buffer->format == 0);
      puVar8 = ensure(output_buffer,uVar11 ^ 3);
      if (puVar8 != (uchar *)0x0) {
        *puVar8 = '{';
        output_buffer->depth = output_buffer->depth + 1;
        if (output_buffer->format != 0) {
          puVar8[1] = '\n';
        }
        output_buffer->offset = output_buffer->offset + (2 - uVar11);
        for (; pcVar14 != (cJSON *)0x0; pcVar14 = pcVar14->next) {
          if (output_buffer->format != 0) {
            puVar8 = ensure(output_buffer,output_buffer->depth);
            cVar5 = 0;
            if (puVar8 == (uchar *)0x0) goto switchD_00103c4a_caseD_3;
            uVar11 = output_buffer->depth;
            if (uVar11 != 0) {
              uVar12 = 0;
              do {
                puVar8[uVar12] = '\t';
                uVar12 = uVar12 + 1;
                uVar11 = output_buffer->depth;
              } while (uVar12 < uVar11);
            }
            output_buffer->offset = output_buffer->offset + uVar11;
            if (puVar8 == (uchar *)0x0) goto switchD_00103c4a_caseD_3;
          }
          cVar4 = print_string_ptr((uchar *)pcVar14->string,output_buffer);
          cVar5 = 0;
          if (cVar4 == 0) goto switchD_00103c4a_caseD_3;
          if (output_buffer->buffer != (uchar *)0x0) {
            sVar15 = output_buffer->offset;
            sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
            output_buffer->offset = sVar9 + sVar15;
          }
          sVar15 = 2 - (ulong)(output_buffer->format == 0);
          puVar8 = ensure(output_buffer,sVar15);
          if (puVar8 == (uchar *)0x0) goto switchD_00103c4a_caseD_3;
          *puVar8 = ':';
          if (output_buffer->format != 0) {
            puVar8[1] = '\t';
          }
          output_buffer->offset = output_buffer->offset + sVar15;
          cVar4 = print_value(pcVar14,output_buffer);
          if (cVar4 == 0) goto switchD_00103c4a_caseD_3;
          if (output_buffer->buffer != (uchar *)0x0) {
            sVar15 = output_buffer->offset;
            sVar9 = strlen((char *)(output_buffer->buffer + sVar15));
            output_buffer->offset = sVar9 + sVar15;
          }
          lVar16 = ((ulong)(pcVar14->next != (cJSON *)0x0) + 1) -
                   (ulong)(output_buffer->format == 0);
          puVar8 = ensure(output_buffer,lVar16 + 1);
          if (puVar8 == (uchar *)0x0) goto switchD_00103c4a_caseD_3;
          if (pcVar14->next != (cJSON *)0x0) {
            *puVar8 = ',';
            puVar8 = puVar8 + 1;
          }
          if (output_buffer->format != 0) {
            *puVar8 = '\n';
            puVar8 = puVar8 + 1;
          }
          *puVar8 = '\0';
          output_buffer->offset = output_buffer->offset + lVar16;
        }
        if (output_buffer->format == 0) {
          sVar15 = 2;
        }
        else {
          sVar15 = output_buffer->depth + 1;
        }
        puVar8 = ensure(output_buffer,sVar15);
        cVar5 = 0;
        if (puVar8 != (uchar *)0x0) {
          if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
            uVar11 = 0;
            do {
              puVar8[uVar11] = '\t';
              uVar11 = uVar11 + 1;
            } while (uVar11 < output_buffer->depth - 1);
            puVar8 = puVar8 + uVar11;
          }
          puVar8[0] = '}';
          puVar8[1] = '\0';
LAB_00104135:
          output_buffer->depth = output_buffer->depth - 1;
          goto LAB_00104139;
        }
      }
    }
    else if ((bVar2 == 0x80) && (item->valuestring != (char *)0x0)) {
      sVar9 = strlen(item->valuestring);
      puVar8 = ensure(output_buffer,sVar9 + 1);
      if (puVar8 != (uchar *)0x0) {
        memcpy(puVar8,item->valuestring,sVar9 + 1);
        goto LAB_00104139;
      }
    }
  }
switchD_00103c4a_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return cVar5;
  }
LAB_0010415d:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}